

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O0

void __thiscall de::cmdline::detail::TypedFieldMap::clear(TypedFieldMap *this)

{
  DestroyFunc p_Var1;
  bool bVar2;
  pointer ppVar3;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>
  local_28;
  iterator local_20;
  _Rb_tree_const_iterator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>
  local_18;
  const_iterator iter;
  TypedFieldMap *this_local;
  
  iter._M_node = (_Base_ptr)this;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<const_std::type_info_*,_de::cmdline::detail::TypedFieldMap::Entry,_std::less<const_std::type_info_*>,_std::allocator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>_>
       ::begin(&this->m_fields);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>
  ::_Rb_tree_const_iterator(&local_18,&local_20);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<const_std::type_info_*,_de::cmdline::detail::TypedFieldMap::Entry,_std::less<const_std::type_info_*>,_std::allocator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>_>
         ::end(&this->m_fields);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>
    ::_Rb_tree_const_iterator(&local_28,&local_30);
    bVar2 = std::operator!=(&local_18,&local_28);
    if (!bVar2) break;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>
             ::operator->(&local_18);
    if ((ppVar3->second).value != (void *)0x0) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>
               ::operator->(&local_18);
      p_Var1 = (ppVar3->second).destructor;
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>
               ::operator->(&local_18);
      (*p_Var1)((ppVar3->second).value);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>
    ::operator++(&local_18);
  }
  std::
  map<const_std::type_info_*,_de::cmdline::detail::TypedFieldMap::Entry,_std::less<const_std::type_info_*>,_std::allocator<std::pair<const_std::type_info_*const,_de::cmdline::detail::TypedFieldMap::Entry>_>_>
  ::clear(&this->m_fields);
  return;
}

Assistant:

void TypedFieldMap::clear (void)
{
	for (Map::const_iterator iter = m_fields.begin(); iter != m_fields.end(); ++iter)
	{
		if (iter->second.value)
			iter->second.destructor(iter->second.value);
	}
	m_fields.clear();
}